

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O3

Bdd __thiscall
sylvan::Bdd::Permute
          (Bdd *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *from,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *to)

{
  uint32_t key;
  long *in_RCX;
  long lVar1;
  ulong uVar2;
  BddMap map;
  MTBDD local_88;
  MTBDD local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  Task local_70;
  
  local_88 = 0;
  local_78 = from;
  mtbdd_protect(&local_88);
  uVar2 = (ulong)(*(long *)(to + 8) - *(long *)to) >> 2 & 0xffffffff;
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)(uint)uVar2 < 0) break;
    lVar1 = (ulong)((uint)uVar2 & 0x7fffffff) * 4;
    key = *(uint32_t *)(*(long *)to + lVar1);
    local_80 = mtbdd_ithvar(*(uint32_t *)(*in_RCX + lVar1));
    mtbdd_protect(&local_80);
    local_88 = mtbdd_map_add(local_88,key,local_80);
    mtbdd_unprotect(&local_80);
  }
  local_70.d._0_8_ = *(undefined8 *)local_78;
  local_70.f = sylvan_compose_WRAP;
  local_70.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
  local_70.d[8] = (undefined1)local_88;
  local_70.d[9] = local_88._1_1_;
  local_70.d[10] = local_88._2_1_;
  local_70.d[0xb] = local_88._3_1_;
  local_70.d[0xc] = local_88._4_1_;
  local_70.d[0xd] = local_88._5_1_;
  local_70.d[0xe] = local_88._6_1_;
  local_70.d[0xf] = local_88._7_1_;
  local_70.d[0x10] = '\0';
  local_70.d[0x11] = '\0';
  local_70.d[0x12] = '\0';
  local_70.d[0x13] = '\0';
  lace_run_task(&local_70);
  this->bdd = local_70.d._0_8_;
  mtbdd_protect(&this->bdd);
  mtbdd_unprotect(&local_88);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::Permute(const std::vector<uint32_t>& from, const std::vector<uint32_t>& to) const
{
    /* Create a map */
    BddMap map;
    for (int i=from.size()-1; i>=0; i--) {
        map.put(from[i], Bdd::bddVar(to[i]));
    }

    return sylvan_compose(bdd, map.bdd);
}